

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fBasicComputeShaderTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_2::CopySSBOToImageCase::iterate(CopySSBOToImageCase *this)

{
  deUint32 *this_00;
  int iVar1;
  value_type vVar2;
  GLsizei GVar3;
  GLsizei GVar4;
  glUseProgramFunc p_Var5;
  glGetProgramResourceIndexFunc p_Var6;
  glBindBufferFunc p_Var7;
  glBindBufferBaseFunc p_Var8;
  glBindTextureFunc p_Var9;
  glTexStorage2DFunc p_Var10;
  glBindImageTextureFunc p_Var11;
  glDispatchComputeFunc p_Var12;
  glBindFramebufferFunc p_Var13;
  glFramebufferTexture2DFunc p_Var14;
  glReadPixelsFunc p_Var15;
  bool bVar16;
  int iVar17;
  deUint32 dVar18;
  GLuint GVar19;
  deBool dVar20;
  GLenum GVar21;
  RenderContext *pRVar22;
  char *pcVar23;
  ostream *poVar24;
  int *piVar25;
  undefined4 extraout_var;
  ProgramSources *sources;
  TestLog *pTVar26;
  TestError *pTVar27;
  MessageBuilder *pMVar28;
  reference puVar29;
  size_type sVar30;
  reference pvVar31;
  void *pvVar32;
  GLuint *pGVar33;
  string local_6f8;
  allocator<char> local_6d1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6b0;
  value_type local_690;
  value_type local_68c;
  deUint32 ref;
  deUint32 res;
  deUint32 ndx_1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> pixels;
  Framebuffer fbo;
  undefined1 local_648 [4];
  deUint32 ndx;
  BufferMemMap bufMap;
  InterfaceVariableInfo valueInfo;
  undefined1 local_5d8 [4];
  deUint32 valueIndex;
  InterfaceBlockInfo blockInfo;
  iterator iStack_588;
  deUint32 blockIndex;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_580;
  iterator i;
  allocator<unsigned_int> local_3f1;
  undefined1 local_3f0 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> inputValues;
  Random rnd;
  IVec2 workSize;
  ShaderSource local_3a0;
  ProgramSources local_378;
  undefined1 local_2a8 [8];
  ShaderProgram program;
  Texture outputTexture;
  Buffer inputBuffer;
  Functions *gl;
  undefined1 local_190 [8];
  ostringstream src;
  GLSLVersion glslVersion;
  CopySSBOToImageCase *this_local;
  Functions *gl_00;
  
  pRVar22 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  src._368_4_ = (*pRVar22->_vptr_RenderContext[2])();
  src._372_4_ = glu::getContextTypeGLSLVersion((ContextType)src._368_4_);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
  pcVar23 = glu::getGLSLVersionDeclaration(src._372_4_);
  poVar24 = std::operator<<((ostream *)local_190,pcVar23);
  poVar24 = std::operator<<(poVar24,"\n");
  poVar24 = std::operator<<(poVar24,"layout (local_size_x = ");
  piVar25 = tcu::Vector<int,_2>::operator[](&this->m_localSize,0);
  poVar24 = (ostream *)std::ostream::operator<<(poVar24,*piVar25);
  poVar24 = std::operator<<(poVar24,", local_size_y = ");
  piVar25 = tcu::Vector<int,_2>::operator[](&this->m_localSize,1);
  poVar24 = (ostream *)std::ostream::operator<<(poVar24,*piVar25);
  poVar24 = std::operator<<(poVar24,") in;\n");
  poVar24 = std::operator<<(poVar24,
                            "layout(r32ui, binding = 1) writeonly uniform highp uimage2D u_dstImg;\n"
                           );
  poVar24 = std::operator<<(poVar24,"buffer Input {\n");
  poVar24 = std::operator<<(poVar24,"    uint values[");
  piVar25 = tcu::Vector<int,_2>::operator[](&this->m_imageSize,0);
  iVar17 = *piVar25;
  piVar25 = tcu::Vector<int,_2>::operator[](&this->m_imageSize,1);
  poVar24 = (ostream *)std::ostream::operator<<(poVar24,iVar17 * *piVar25);
  poVar24 = std::operator<<(poVar24,"];\n");
  poVar24 = std::operator<<(poVar24,"} sb_in;\n\n");
  poVar24 = std::operator<<(poVar24,"void main (void) {\n");
  poVar24 = std::operator<<(poVar24,"    uint stride = gl_NumWorkGroups.x*gl_WorkGroupSize.x;\n");
  poVar24 = std::operator<<(poVar24,
                            "    uint value  = sb_in.values[gl_GlobalInvocationID.y*stride + gl_GlobalInvocationID.x];\n"
                           );
  poVar24 = std::operator<<(poVar24,
                            "    imageStore(u_dstImg, ivec2(gl_GlobalInvocationID.xy), uvec4(value, 0, 0, 0));\n"
                           );
  std::operator<<(poVar24,"}\n");
  pRVar22 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  iVar17 = (*pRVar22->_vptr_RenderContext[3])();
  gl_00 = (Functions *)CONCAT44(extraout_var,iVar17);
  pRVar22 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  glu::TypedObjectWrapper<(glu::ObjectType)1>::TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)1> *)&outputTexture.super_ObjectWrapper.m_object,
             pRVar22);
  pRVar22 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  glu::TypedObjectWrapper<(glu::ObjectType)0>::TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)0> *)&program.m_program.m_info.linkTimeUs,pRVar22)
  ;
  pRVar22 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  glu::ProgramSources::ProgramSources(&local_378);
  std::__cxx11::ostringstream::str();
  glu::ShaderSource::ShaderSource(&local_3a0,SHADERTYPE_COMPUTE,(string *)&workSize);
  sources = glu::ProgramSources::operator<<(&local_378,&local_3a0);
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_2a8,pRVar22,sources);
  glu::ShaderSource::~ShaderSource(&local_3a0);
  std::__cxx11::string::~string((string *)&workSize);
  glu::ProgramSources::~ProgramSources(&local_378);
  tcu::operator/((tcu *)&rnd.m_rnd.z,&this->m_imageSize,&this->m_localSize);
  de::Random::Random((Random *)
                     &inputValues.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,0x77238ac2);
  piVar25 = tcu::Vector<int,_2>::operator[](&this->m_imageSize,0);
  iVar17 = *piVar25;
  piVar25 = tcu::Vector<int,_2>::operator[](&this->m_imageSize,1);
  iVar1 = *piVar25;
  std::allocator<unsigned_int>::allocator(&local_3f1);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_3f0,(long)(iVar17 * iVar1)
             ,&local_3f1);
  std::allocator<unsigned_int>::~allocator(&local_3f1);
  pTVar26 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)
  ;
  glu::operator<<(pTVar26,(ShaderProgram *)local_2a8);
  bVar16 = glu::ShaderProgram::isOk((ShaderProgram *)local_2a8);
  if (!bVar16) {
    pTVar27 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar27,"Compile failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fBasicComputeShaderTests.cpp"
               ,0x47e);
    __cxa_throw(pTVar27,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  pTVar26 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)
  ;
  tcu::TestLog::operator<<((MessageBuilder *)&i,pTVar26,(BeginMessageToken *)&tcu::TestLog::Message)
  ;
  pMVar28 = tcu::MessageBuilder::operator<<((MessageBuilder *)&i,(char (*) [14])"Work groups: ");
  pMVar28 = tcu::MessageBuilder::operator<<(pMVar28,(Vector<int,_2> *)&rnd.m_rnd.z);
  tcu::MessageBuilder::operator<<(pMVar28,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&i);
  p_Var5 = gl_00->useProgram;
  dVar18 = glu::ShaderProgram::getProgram((ShaderProgram *)local_2a8);
  (*p_Var5)(dVar18);
  local_580._M_current =
       (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_3f0);
  while( true ) {
    iStack_588 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_3f0);
    bVar16 = __gnu_cxx::operator!=(&local_580,&stack0xfffffffffffffa78);
    if (!bVar16) break;
    dVar18 = de::Random::getUint32
                       ((Random *)
                        &inputValues.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
    puVar29 = __gnu_cxx::
              __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
              ::operator*(&local_580);
    *puVar29 = dVar18;
    __gnu_cxx::
    __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
    operator++(&local_580);
  }
  p_Var6 = gl_00->getProgramResourceIndex;
  dVar18 = glu::ShaderProgram::getProgram((ShaderProgram *)local_2a8);
  blockInfo.activeVariables.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = (*p_Var6)(dVar18,0x92e6,"Input");
  dVar18 = glu::ShaderProgram::getProgram((ShaderProgram *)local_2a8);
  glu::getProgramInterfaceBlockInfo
            ((InterfaceBlockInfo *)local_5d8,gl_00,dVar18,0x92e6,
             blockInfo.activeVariables.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._4_4_);
  p_Var6 = gl_00->getProgramResourceIndex;
  dVar18 = glu::ShaderProgram::getProgram((ShaderProgram *)local_2a8);
  GVar19 = (*p_Var6)(dVar18,0x92e5,"Input.values");
  dVar18 = glu::ShaderProgram::getProgram((ShaderProgram *)local_2a8);
  glu::getProgramInterfaceVariableInfo
            ((InterfaceVariableInfo *)&bufMap.m_ptr,gl_00,dVar18,0x92e5,GVar19);
  p_Var7 = gl_00->bindBuffer;
  dVar18 = glu::ObjectWrapper::operator*
                     ((ObjectWrapper *)&outputTexture.super_ObjectWrapper.m_object);
  (*p_Var7)(0x90d2,dVar18);
  (*gl_00->bufferData)(0x90d2,(ulong)blockInfo.index,(void *)0x0,0x88e4);
  do {
    dVar20 = ::deGetFalse();
    if (dVar20 != 0) {
LAB_023e3902:
      pTVar27 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar27,(char *)0x0,"valueInfo.arraySize == (deUint32)inputValues.size()",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fBasicComputeShaderTests.cpp"
                 ,0x492);
      __cxa_throw(pTVar27,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    sVar30 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_3f0);
    if (valueInfo.atomicCounterBufferIndex != (deUint32)sVar30) goto LAB_023e3902;
    dVar20 = ::deGetFalse();
  } while (dVar20 != 0);
  BufferMemMap::BufferMemMap((BufferMemMap *)local_648,gl_00,0x90d2,0,blockInfo.index,2);
  fbo.super_ObjectWrapper._20_4_ = 0;
  while( true ) {
    sVar30 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_3f0);
    if ((uint)sVar30 <= (uint)fbo.super_ObjectWrapper._20_4_) break;
    pvVar31 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_3f0,
                         (ulong)(uint)fbo.super_ObjectWrapper._20_4_);
    vVar2 = *pvVar31;
    pvVar32 = BufferMemMap::getPtr((BufferMemMap *)local_648);
    *(value_type *)
     ((long)pvVar32 +
     (ulong)(fbo.super_ObjectWrapper._20_4_ * valueInfo.arraySize) + (ulong)valueInfo.type) = vVar2;
    fbo.super_ObjectWrapper._20_4_ = fbo.super_ObjectWrapper._20_4_ + 1;
  }
  BufferMemMap::~BufferMemMap((BufferMemMap *)local_648);
  p_Var8 = gl_00->bindBufferBase;
  dVar18 = glu::ObjectWrapper::operator*
                     ((ObjectWrapper *)&outputTexture.super_ObjectWrapper.m_object);
  (*p_Var8)(0x90d2,blockInfo.name.field_2._12_4_,dVar18);
  GVar21 = (*gl_00->getError)();
  glu::checkError(GVar21,"Input buffer setup failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fBasicComputeShaderTests.cpp"
                  ,0x49c);
  glu::InterfaceVariableInfo::~InterfaceVariableInfo((InterfaceVariableInfo *)&bufMap.m_ptr);
  glu::InterfaceBlockInfo::~InterfaceBlockInfo((InterfaceBlockInfo *)local_5d8);
  p_Var9 = gl_00->bindTexture;
  dVar18 = glu::ObjectWrapper::operator*((ObjectWrapper *)&program.m_program.m_info.linkTimeUs);
  (*p_Var9)(0xde1,dVar18);
  p_Var10 = gl_00->texStorage2D;
  piVar25 = tcu::Vector<int,_2>::operator[](&this->m_imageSize,0);
  GVar3 = *piVar25;
  piVar25 = tcu::Vector<int,_2>::operator[](&this->m_imageSize,1);
  (*p_Var10)(0xde1,1,0x8236,GVar3,*piVar25);
  (*gl_00->texParameteri)(0xde1,0x2801,0x2600);
  (*gl_00->texParameteri)(0xde1,0x2800,0x2600);
  GVar21 = (*gl_00->getError)();
  glu::checkError(GVar21,"Uploading image data failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fBasicComputeShaderTests.cpp"
                  ,0x4a4);
  p_Var11 = gl_00->bindImageTexture;
  dVar18 = glu::ObjectWrapper::operator*((ObjectWrapper *)&program.m_program.m_info.linkTimeUs);
  (*p_Var11)(1,dVar18,0,'\0',0,0x88b9,0x8236);
  GVar21 = (*gl_00->getError)();
  glu::checkError(GVar21,"Image setup failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fBasicComputeShaderTests.cpp"
                  ,0x4a8);
  p_Var12 = gl_00->dispatchCompute;
  this_00 = &rnd.m_rnd.z;
  pGVar33 = (GLuint *)tcu::Vector<int,_2>::operator[]((Vector<int,_2> *)this_00,0);
  GVar19 = *pGVar33;
  pGVar33 = (GLuint *)tcu::Vector<int,_2>::operator[]((Vector<int,_2> *)this_00,1);
  (*p_Var12)(GVar19,*pGVar33,1);
  GVar21 = (*gl_00->getError)();
  glu::checkError(GVar21,"glDispatchCompute()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fBasicComputeShaderTests.cpp"
                  ,0x4ac);
  pRVar22 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  glu::TypedObjectWrapper<(glu::ObjectType)3>::TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)3> *)
             &pixels.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,pRVar22);
  sVar30 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_3f0);
  std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)((long)&res + 3));
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&ndx_1,sVar30 << 2,
             (allocator<unsigned_int> *)((long)&res + 3));
  std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)((long)&res + 3));
  p_Var13 = gl_00->bindFramebuffer;
  dVar18 = glu::ObjectWrapper::operator*
                     ((ObjectWrapper *)
                      &pixels.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage);
  (*p_Var13)(0x8d40,dVar18);
  p_Var14 = gl_00->framebufferTexture2D;
  dVar18 = glu::ObjectWrapper::operator*((ObjectWrapper *)&program.m_program.m_info.linkTimeUs);
  (*p_Var14)(0x8d40,0x8ce0,0xde1,dVar18,0);
  while( true ) {
    dVar20 = ::deGetFalse();
    if (dVar20 != 0) break;
    GVar21 = (*gl_00->checkFramebufferStatus)(0x8d40);
    if (GVar21 != 0x8cd5) break;
    dVar20 = ::deGetFalse();
    if (dVar20 == 0) {
      (*gl_00->readBuffer)(0x8ce0);
      p_Var15 = gl_00->readPixels;
      piVar25 = tcu::Vector<int,_2>::operator[](&this->m_imageSize,0);
      GVar3 = *piVar25;
      piVar25 = tcu::Vector<int,_2>::operator[](&this->m_imageSize,1);
      GVar4 = *piVar25;
      pvVar31 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&ndx_1,0);
      (*p_Var15)(0,0,GVar3,GVar4,0x8d99,0x1405,pvVar31);
      GVar21 = (*gl_00->getError)();
      glu::checkError(GVar21,"Reading pixels failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fBasicComputeShaderTests.cpp"
                      ,0x4ba);
      ref = 0;
      while( true ) {
        dVar18 = ref;
        sVar30 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_3f0);
        if ((uint)sVar30 <= dVar18) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&ndx_1);
          glu::TypedObjectWrapper<(glu::ObjectType)3>::~TypedObjectWrapper
                    ((TypedObjectWrapper<(glu::ObjectType)3> *)
                     &pixels.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                      .super__Vector_impl_data._M_end_of_storage);
          tcu::TestContext::setTestResult
                    ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                     QP_TEST_RESULT_PASS,"Pass");
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_3f0);
          de::Random::~Random((Random *)
                              &inputValues.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage);
          glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_2a8);
          glu::TypedObjectWrapper<(glu::ObjectType)0>::~TypedObjectWrapper
                    ((TypedObjectWrapper<(glu::ObjectType)0> *)&program.m_program.m_info.linkTimeUs)
          ;
          glu::TypedObjectWrapper<(glu::ObjectType)1>::~TypedObjectWrapper
                    ((TypedObjectWrapper<(glu::ObjectType)1> *)
                     &outputTexture.super_ObjectWrapper.m_object);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
          return STOP;
        }
        pvVar31 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&ndx_1,
                             (ulong)(ref << 2));
        local_68c = *pvVar31;
        pvVar31 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_3f0,
                             (ulong)ref);
        local_690 = *pvVar31;
        if (local_68c != local_690) break;
        ref = ref + 1;
      }
      pTVar27 = (TestError *)__cxa_allocate_exception(0x38);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_6d0,"Comparison failed for pixel ",&local_6d1);
      de::toString<unsigned_int>(&local_6f8,&ref);
      std::operator+(&local_6b0,&local_6d0,&local_6f8);
      tcu::TestError::TestError(pTVar27,&local_6b0);
      __cxa_throw(pTVar27,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
  }
  pTVar27 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (pTVar27,(char *)0x0,
             "gl.checkFramebufferStatus(GL_FRAMEBUFFER) == GL_FRAMEBUFFER_COMPLETE",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fBasicComputeShaderTests.cpp"
             ,0x4b5);
  __cxa_throw(pTVar27,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

IterateResult iterate (void)
	{
		const GLSLVersion			glslVersion		= glu::getContextTypeGLSLVersion(m_context.getRenderContext().getType());
		std::ostringstream			src;

		src << getGLSLVersionDeclaration(glslVersion) << "\n"
			<< "layout (local_size_x = " << m_localSize[0] << ", local_size_y = " << m_localSize[1] << ") in;\n"
			<< "layout(r32ui, binding = 1) writeonly uniform highp uimage2D u_dstImg;\n"
			<< "buffer Input {\n"
			<< "    uint values[" << (m_imageSize[0]*m_imageSize[1]) << "];\n"
			<< "} sb_in;\n\n"
			<< "void main (void) {\n"
			<< "    uint stride = gl_NumWorkGroups.x*gl_WorkGroupSize.x;\n"
			<< "    uint value  = sb_in.values[gl_GlobalInvocationID.y*stride + gl_GlobalInvocationID.x];\n"
			<< "    imageStore(u_dstImg, ivec2(gl_GlobalInvocationID.xy), uvec4(value, 0, 0, 0));\n"
			<< "}\n";

		const glw::Functions&		gl				= m_context.getRenderContext().getFunctions();
		const Buffer				inputBuffer		(m_context.getRenderContext());
		const Texture				outputTexture	(m_context.getRenderContext());
		const ShaderProgram			program			(m_context.getRenderContext(), ProgramSources() << ShaderSource(SHADERTYPE_COMPUTE, src.str()));
		const tcu::IVec2			workSize		= m_imageSize / m_localSize;
		de::Random					rnd				(0x77238ac2);
		vector<deUint32>			inputValues		(m_imageSize[0]*m_imageSize[1]);

		m_testCtx.getLog() << program;
		if (!program.isOk())
			TCU_FAIL("Compile failed");

		m_testCtx.getLog() << TestLog::Message << "Work groups: " << workSize << TestLog::EndMessage;

		gl.useProgram(program.getProgram());

		// Input values
		for (vector<deUint32>::iterator i = inputValues.begin(); i != inputValues.end(); ++i)
			*i = rnd.getUint32();

		// Input buffer setup
		{
			const deUint32				blockIndex	= gl.getProgramResourceIndex(program.getProgram(), GL_SHADER_STORAGE_BLOCK, "Input");
			const InterfaceBlockInfo	blockInfo	= getProgramInterfaceBlockInfo(gl, program.getProgram(), GL_SHADER_STORAGE_BLOCK, blockIndex);
			const deUint32				valueIndex	= gl.getProgramResourceIndex(program.getProgram(), GL_BUFFER_VARIABLE, "Input.values");
			const InterfaceVariableInfo	valueInfo	= getProgramInterfaceVariableInfo(gl, program.getProgram(), GL_BUFFER_VARIABLE, valueIndex);

			gl.bindBuffer(GL_SHADER_STORAGE_BUFFER, *inputBuffer);
			gl.bufferData(GL_SHADER_STORAGE_BUFFER, (glw::GLsizeiptr)blockInfo.dataSize, DE_NULL, GL_STATIC_DRAW);

			TCU_CHECK(valueInfo.arraySize == (deUint32)inputValues.size());

			{
				const BufferMemMap bufMap(gl, GL_SHADER_STORAGE_BUFFER, 0, (int)blockInfo.dataSize, GL_MAP_WRITE_BIT);

				for (deUint32 ndx = 0; ndx < (deUint32)inputValues.size(); ndx++)
					*(deUint32*)((deUint8*)bufMap.getPtr() + valueInfo.offset + ndx*valueInfo.arrayStride) = inputValues[ndx];
			}

			gl.bindBufferBase(GL_SHADER_STORAGE_BUFFER, blockInfo.bufferBinding, *inputBuffer);
			GLU_EXPECT_NO_ERROR(gl.getError(), "Input buffer setup failed");
		}

		// Output image setup
		gl.bindTexture(GL_TEXTURE_2D, *outputTexture);
		gl.texStorage2D(GL_TEXTURE_2D, 1, GL_R32UI, m_imageSize[0], m_imageSize[1]);
		gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
		gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Uploading image data failed");

		// Bind to unit 1
		gl.bindImageTexture(1, *outputTexture, 0, GL_FALSE, 0, GL_WRITE_ONLY, GL_R32UI);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Image setup failed");

		// Dispatch compute workload
		gl.dispatchCompute(workSize[0], workSize[1], 1);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glDispatchCompute()");

		// Read back and compare
		{
			Framebuffer			fbo			(m_context.getRenderContext());
			vector<deUint32>	pixels		(inputValues.size()*4);

			gl.bindFramebuffer(GL_FRAMEBUFFER, *fbo);
			gl.framebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, *outputTexture, 0);
			TCU_CHECK(gl.checkFramebufferStatus(GL_FRAMEBUFFER) == GL_FRAMEBUFFER_COMPLETE);

			// \note In ES3 we have to use GL_RGBA_INTEGER
			gl.readBuffer(GL_COLOR_ATTACHMENT0);
			gl.readPixels(0, 0, m_imageSize[0], m_imageSize[1], GL_RGBA_INTEGER, GL_UNSIGNED_INT, &pixels[0]);
			GLU_EXPECT_NO_ERROR(gl.getError(), "Reading pixels failed");

			for (deUint32 ndx = 0; ndx < (deUint32)inputValues.size(); ndx++)
			{
				const deUint32	res		= pixels[ndx*4];
				const deUint32	ref		= inputValues[ndx];

				if (res != ref)
					throw tcu::TestError(string("Comparison failed for pixel ") + de::toString(ndx));
			}
		}

		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		return STOP;
	}